

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_int,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_int,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  uintwide_t<32U,_unsigned_int,_void,_true> uVar1;
  uintwide_t<32U,_unsigned_int,_void,_true> *v;
  unsigned_fast_type uVar2;
  long lVar3;
  byte bVar4;
  array<unsigned_int,_1UL> aVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  ulong uVar8;
  uintwide_t<32U,_unsigned_int,_void,_false> t;
  byte local_58 [8];
  undefined8 uStack_50;
  undefined2 local_48;
  undefined1 local_46;
  value_type_conflict local_44 [1];
  representation_type local_40;
  uintwide_t<32U,_unsigned_int,_void,_true> tmp;
  
  iVar6 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar6 == 0x10) {
    t.values.super_array<unsigned_int,_1UL>.elems[0] = *(representation_type *)this;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    uStack_50 = 0;
    if (t.values.super_array<unsigned_int,_1UL>.elems[0] == (array<unsigned_int,_1UL>)0x0) {
      uStack_50 = 0x30000000000000;
      uVar8 = 0xe;
    }
    else {
      uVar2 = uintwide_t<32U,_unsigned_int,_void,_true>::extract_hex_digits<false,_nullptr>
                        (&t,(char *)((long)&uStack_50 + 7),is_uppercase);
      uVar8 = 0xf - uVar2;
    }
    if ((show_base) && (1 < (long)uVar8)) {
      local_58[(int)uVar8 - 1] = !is_uppercase << 5 | 0x58;
      uVar8 = uVar8 - 2;
      local_58[uVar8 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar8)) {
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      uVar7 = 0xf;
      if (field_width < 0xf) {
        uVar7 = field_width;
      }
      while ((long)(uVar7 ^ 0xf) < (long)uVar8) {
        uVar8 = uVar8 - 1;
        local_58[uVar8 & 0xffffffff] = fill_char_str;
      }
    }
    uStack_50 = uStack_50 & 0xffffffffffffff;
    goto LAB_00138a2e;
  }
  if (iVar6 != 10) {
    if (iVar6 != 8) {
      return false;
    }
    t.values.super_array<unsigned_int,_1UL>.elems[0] = *(representation_type *)this;
    local_48 = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    uStack_50 = 0;
    if (t.values.super_array<unsigned_int,_1UL>.elems[0] == (array<unsigned_int,_1UL>)0x0) {
      local_48 = 0x3000;
      uVar8 = 0x11;
    }
    else {
      uVar8 = 0x12;
      while ((uVar8 != 0 &&
             ((array<unsigned_int,_1UL>)t.values.super_array<unsigned_int,_1UL>.elems[0] !=
              (array<unsigned_int,_1UL>)0x0))) {
        uVar8 = uVar8 - 1;
        local_58[uVar8 & 0xffffffff] =
             (byte)t.values.super_array<unsigned_int,_1UL>.elems[0] & 7 | 0x30;
        uintwide_t<32U,_unsigned_int,_void,_false>::shr<unsigned_int>(&t,3);
      }
    }
    if (show_base && uVar8 != 0) {
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] = 0x30;
    }
    if (show_pos && uVar8 != 0) {
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar3 = 0;
      if (field_width < 0x13) {
        lVar3 = 0x12 - field_width;
      }
      while (lVar3 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        local_58[uVar8 & 0xffffffff] = fill_char_str;
      }
    }
    local_46 = 0;
    goto LAB_00138a2e;
  }
  aVar5.elems[0] = *(value_type_conflict (*) [1])this;
  t.values.super_array<unsigned_int,_1UL>.elems[0] =
       (representation_type)(representation_type)-(int)aVar5.elems[0];
  if (0 < (int)aVar5.elems[0]) {
    t.values.super_array<unsigned_int,_1UL>.elems[0] =
         (representation_type)(representation_type)aVar5.elems[0];
  }
  local_48 = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  uStack_50 = 0;
  if (aVar5.elems[0] == 0) {
    local_48 = 0x3000;
    uVar8 = 0x11;
LAB_001388de:
    if ((int)aVar5.elems[0] < 0 || show_pos) {
      bVar4 = 0x2d;
      if (-1 < (int)aVar5.elems[0]) {
        bVar4 = !show_pos * '\x02' + 0x2b;
      }
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] = bVar4;
    }
  }
  else {
    uVar8 = 0x12;
    local_44[0] = aVar5.elems[0];
    while ((uVar8 != 0 &&
           ((array<unsigned_int,_1UL>)t.values.super_array<unsigned_int,_1UL>.elems[0] !=
            (array<unsigned_int,_1UL>)0x0))) {
      tmp.values.super_array<unsigned_int,_1UL>.elems[0] =
           t.values.super_array<unsigned_int,_1UL>.elems[0];
      uintwide_t<32U,_unsigned_int,_void,_true>::eval_divide_by_single_limb
                ((uintwide_t<32U,_unsigned_int,_void,_true> *)&t,10,0,
                 (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0);
      local_40.super_array<unsigned_int,_1UL>.elems[0] =
           (array<unsigned_int,_1UL>)
           (array<unsigned_int,_1UL>)t.values.super_array<unsigned_int,_1UL>.elems[0];
      v = uintwide_t<32U,_unsigned_int,_void,_true>::mul_by_limb
                    ((uintwide_t<32U,_unsigned_int,_void,_true> *)&local_40,10);
      uVar1 = wide_integer::operator-(&tmp,v);
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] =
           (char)uVar1.values.super_array<unsigned_int,_1UL>.elems[0] + 0x30;
    }
    aVar5.elems[0] = (value_type_conflict  [1])(value_type_conflict  [1])local_44[0];
    if (uVar8 != 0) goto LAB_001388de;
    uVar8 = 0;
  }
  if (field_width != 0) {
    lVar3 = 0;
    if (field_width < 0x13) {
      lVar3 = 0x12 - field_width;
    }
    while (lVar3 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      local_58[uVar8 & 0xffffffff] = fill_char_str;
    }
  }
  local_46 = 0;
LAB_00138a2e:
  detail::strcpy_unsafe<char*,char*>(str_result,(char *)(local_58 + uVar8));
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }